

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wxcli.hpp
# Opt level: O2

string * __thiscall
ws::msg_type_to_str_abi_cxx11_(string *__return_storage_ptr__,ws *this,MsgType type)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "none";
    __a = &local_9;
    break;
  case 1:
    __s = "text";
    __a = &local_a;
    break;
  case 2:
    __s = "file";
    __a = &local_b;
    break;
  case 3:
    __s = "markdown";
    __a = &local_c;
    break;
  case 4:
    __s = "image";
    __a = &local_d;
    break;
  default:
    __s = "none";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string msg_type_to_str(MsgType type)
  {
    switch (type)
    {
      case MsgType::none:
        return "none";
      case MsgType::text:
        return "text";
      case MsgType::file:
        return "file";
      case MsgType::markdown:
        return "markdown";
      case MsgType::image:
        return "image";
    }
    return "none";
  }